

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8 * google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target)

{
  uint32 uVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int iVar3;
  uint32 value;
  UnknownField *this;
  uint8 *puVar4;
  UnknownFieldSet *unknown_fields_00;
  uint64 uVar5;
  string *value_00;
  int i;
  int index;
  
  index = 0;
  while( true ) {
    pvVar2 = unknown_fields->fields_;
    iVar3 = 0;
    if (pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      iVar3 = (int)((ulong)((long)(pvVar2->
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar2->
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (iVar3 <= index) break;
    this = UnknownFieldSet::field(unknown_fields,index);
    switch(this->type_) {
    case 0:
      uVar1 = this->number_;
      uVar5 = UnknownField::varint(this);
      target = WireFormatLite::WriteInt64ToArray(uVar1,uVar5,target);
      break;
    case 1:
      uVar1 = this->number_;
      value = UnknownField::fixed32(this);
      target = WireFormatLite::WriteFixed32ToArray(uVar1,value,target);
      break;
    case 2:
      uVar1 = this->number_;
      uVar5 = UnknownField::fixed64(this);
      target = WireFormatLite::WriteFixed64ToArray(uVar1,uVar5,target);
      break;
    case 3:
      uVar1 = this->number_;
      value_00 = UnknownField::length_delimited_abi_cxx11_(this);
      target = WireFormatLite::WriteBytesToArray(uVar1,value_00,target);
      break;
    case 4:
      puVar4 = WireFormatLite::WriteTagToArray(this->number_,WIRETYPE_START_GROUP,target);
      unknown_fields_00 = UnknownField::group(this);
      puVar4 = SerializeUnknownFieldsToArray(unknown_fields_00,puVar4);
      target = WireFormatLite::WriteTagToArray(this->number_,WIRETYPE_END_GROUP,puVar4);
    }
    index = index + 1;
  }
  return target;
}

Assistant:

uint8* WireFormat::SerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields,
    uint8* target) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteInt64ToArray(
            field.number(), field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(
            field.number(), field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(
            field.number(), field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = WireFormatLite::WriteBytesToArray(
            field.number(), field.length_delimited(), target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = SerializeUnknownFieldsToArray(field.group(), target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}